

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

Vec4 __thiscall
vkt::api::anon_unknown_0::getFormatThreshold(anon_unknown_0 *this,TextureFormat *format)

{
  ChannelType CVar1;
  uint uVar2;
  float fVar3;
  undefined4 uVar4;
  ulong in_XMM1_Qa;
  float fVar5;
  float fVar6;
  float fVar7;
  Vec4 VVar8;
  IVec4 bits;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  CVar1 = format->type;
  if ((int)CVar1 < 0x23) {
    if (CVar1 == UNSIGNED_INT_11F_11F_10F_REV) {
      fVar3 = 0.02;
      fVar5 = 0.02;
      fVar6 = 0.0625;
      uVar4 = 0x3f800000;
      goto LAB_00473d26;
    }
    if (CVar1 == UNSIGNED_INT_999_E5_REV) {
      fVar3 = 0.05;
      fVar5 = 0.05;
      fVar6 = 0.05;
      uVar4 = 0x3f800000;
      goto LAB_00473d26;
    }
    if (CVar1 == HALF_FLOAT) {
      fVar3 = 0.005;
      fVar5 = 0.005;
      fVar6 = 0.005;
      uVar4 = 0x3ba3d70a;
      goto LAB_00473d26;
    }
  }
  else if (CVar1 - FLOAT < 2) {
    fVar3 = 0.001;
    fVar5 = 0.001;
    fVar6 = 0.001;
    uVar4 = 0x3a83126f;
    goto LAB_00473d26;
  }
  tcu::getTextureFormatMantissaBitDepth((tcu *)&local_28,format);
  in_XMM1_Qa = 0x3f800000;
  fVar3 = 1.0;
  if (0 < (int)local_28) {
    uVar2 = 0x20;
    if (local_28 < 0x20) {
      uVar2 = local_28;
    }
    fVar5 = (float)(1L << ((byte)uVar2 & 0x3f)) + -1.0;
    if (fVar5 <= 1.0) {
      fVar5 = 1.0;
    }
    fVar3 = 1.0;
    if (1.0 / fVar5 <= 1.0) {
      fVar3 = 1.0 / fVar5;
    }
  }
  fVar5 = 1.0;
  if (0 < (int)local_24) {
    uVar2 = 0x20;
    if (local_24 < 0x20) {
      uVar2 = local_24;
    }
    fVar6 = (float)(1L << ((byte)uVar2 & 0x3f)) + -1.0;
    if (fVar6 <= 1.0) {
      fVar6 = 1.0;
    }
    fVar5 = 1.0;
    if (1.0 / fVar6 <= 1.0) {
      fVar5 = 1.0 / fVar6;
    }
  }
  fVar6 = 1.0;
  if (0 < (int)local_20) {
    uVar2 = 0x20;
    if (local_20 < 0x20) {
      uVar2 = local_20;
    }
    fVar7 = (float)(1L << ((byte)uVar2 & 0x3f)) + -1.0;
    if (fVar7 <= 1.0) {
      fVar7 = 1.0;
    }
    fVar6 = 1.0;
    if (1.0 / fVar7 <= 1.0) {
      fVar6 = 1.0 / fVar7;
    }
  }
  if (0 < (int)local_1c) {
    uVar2 = 0x20;
    if (local_1c < 0x20) {
      uVar2 = local_1c;
    }
    fVar7 = (float)(1L << ((byte)uVar2 & 0x3f)) + -1.0;
    in_XMM1_Qa = 0x3f800000;
    if (fVar7 <= 1.0) {
      fVar7 = 1.0;
    }
    if (1.0 / fVar7 <= 1.0) {
      in_XMM1_Qa = (ulong)(uint)(1.0 / fVar7);
    }
  }
  uVar4 = (undefined4)in_XMM1_Qa;
LAB_00473d26:
  fVar7 = fVar3;
  if ((format->order & ~A) == BGR) {
    fVar7 = fVar6;
    fVar6 = fVar3;
  }
  *(float *)this = fVar7;
  *(float *)(this + 4) = fVar5;
  *(float *)(this + 8) = fVar6;
  *(undefined4 *)(this + 0xc) = uVar4;
  VVar8.m_data[1] = fVar5;
  VVar8.m_data[0] = fVar7;
  VVar8.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar8.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar8.m_data;
}

Assistant:

tcu::Vec4 getFormatThreshold (const tcu::TextureFormat& format)
{
	tcu::Vec4 threshold(0.01f);

	switch (format.type)
	{
	case tcu::TextureFormat::HALF_FLOAT:
		threshold = tcu::Vec4(0.005f);
		break;

	case tcu::TextureFormat::FLOAT:
	case tcu::TextureFormat::FLOAT64:
		threshold = tcu::Vec4(0.001f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		threshold = tcu::Vec4(0.02f, 0.02f, 0.0625f, 1.0f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_999_E5_REV:
		threshold = tcu::Vec4(0.05f, 0.05f, 0.05f, 1.0f);
		break;

	default:
		const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);
		threshold = tcu::Vec4(calculateFloatConversionError(bits.x()),
				      calculateFloatConversionError(bits.y()),
				      calculateFloatConversionError(bits.z()),
				      calculateFloatConversionError(bits.w()));
	}

	// Return value matching the channel order specified by the format
	if (format.order == tcu::TextureFormat::BGR || format.order == tcu::TextureFormat::BGRA)
		return threshold.swizzle(2, 1, 0, 3);
	else
		return threshold;
}